

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O0

objc_slot * objc_msg_lookup_sender(id *receiver,SEL selector,id sender)

{
  char cVar1;
  objc_slot2 oVar2;
  BOOL BVar3;
  uint32_t index;
  IMP p_Var4;
  id poVar5;
  undefined8 *puVar6;
  char *pcVar7;
  long lVar8;
  objc_slot *poVar9;
  bool bVar10;
  objc_slot2 *slot;
  char *t;
  id sender_local;
  SEL selector_local;
  id *receiver_local;
  id newReceiver;
  dtable_t dtable;
  objc_slot2 *result;
  Class class;
  dtable_t local_28;
  uintptr_t addr;
  Class local_10;
  
  if (*receiver == (id)0x0) {
    if (selector->types != (char *)0x0) {
      slot = (objc_slot2 *)selector->types;
      while( true ) {
        bVar10 = true;
        if ((((*(char *)&slot->method != 'r') && (bVar10 = true, *(char *)&slot->method != 'n')) &&
            (bVar10 = true, *(char *)&slot->method != 'N')) &&
           (((bVar10 = true, *(char *)&slot->method != 'o' &&
             (bVar10 = true, *(char *)&slot->method != 'O')) &&
            ((bVar10 = true, *(char *)&slot->method != 'R' &&
             (bVar10 = true, *(char *)&slot->method != 'V')))))) {
          bVar10 = *(char *)&slot->method == 'A';
        }
        if (!bVar10) break;
        slot = (objc_slot2 *)((long)&slot->method + 1);
      }
      cVar1 = *selector->types;
      if (cVar1 == 'D') {
        receiver_local = (id *)&nil_slot_D_v1;
        return (objc_slot *)receiver_local;
      }
      if (cVar1 == 'd') {
        receiver_local = (id *)&nil_slot_d_v1;
        return (objc_slot *)receiver_local;
      }
      if (cVar1 == 'f') {
        receiver_local = (id *)&nil_slot_f_v1;
        return (objc_slot *)receiver_local;
      }
    }
    receiver_local = (id *)&nil_slot_v1;
    return (objc_slot *)receiver_local;
  }
  poVar5 = *receiver;
  BVar3 = isSmallObject(poVar5);
  if (BVar3 == '\0') {
    local_10 = poVar5->isa;
  }
  else {
    local_10 = SmallObjectClasses[(ulong)poVar5 & 7];
  }
  dtable = (dtable_t)
           SparseArrayLookup((SparseArray *)local_10->dtable,(uint32_t)(selector->field_0).index);
  if (dtable == (dtable_t)0x0) {
    newReceiver = (id)dtable_for_class(local_10);
    if ((dtable_t)newReceiver == uninstalled_dtable) {
      objc_send_initialize(*receiver);
      newReceiver = (id)dtable_for_class(local_10);
      dtable = (dtable_t)
               SparseArrayLookup((SparseArray *)newReceiver,(uint32_t)(selector->field_0).index);
    }
    else {
      dtable = (dtable_t)
               SparseArrayLookup((SparseArray *)newReceiver,(uint32_t)(selector->field_0).index);
    }
    if (dtable == (dtable_t)0x0) {
      index = get_untyped_idx(selector);
      dtable = (dtable_t)SparseArrayLookup((SparseArray *)newReceiver,index);
      if (dtable != (dtable_t)0x0) {
        p_Var4 = call_mismatch_hook(local_10,selector,(objc_slot2 *)dtable);
        puVar6 = (undefined8 *)__tls_get_addr(&PTR_0014af58);
        *puVar6 = p_Var4;
        dtable = (dtable_t)__tls_get_addr(&PTR_0014af58);
      }
      poVar5 = (*objc_proxy_lookup)(*receiver,selector);
      if (poVar5 != (id)0x0) {
        *receiver = poVar5;
        local_28 = (dtable_t)objc_slot_lookup(receiver,selector);
        goto LAB_00123337;
      }
      if (dtable == (dtable_t)0x0) {
        p_Var4 = (*__objc_msg_forward2)(*receiver,selector);
        puVar6 = (undefined8 *)__tls_get_addr(&PTR_0014af58);
        *puVar6 = p_Var4;
        dtable = (dtable_t)__tls_get_addr(&PTR_0014af58);
      }
    }
  }
  local_28 = dtable;
LAB_00123337:
  puVar6 = (undefined8 *)__tls_get_addr(&PTR_0014af10);
  *puVar6 = 0;
  pcVar7 = sel_getType_np((SEL)local_28->data[0]);
  lVar8 = __tls_get_addr(&PTR_0014af10);
  *(char **)(lVar8 + 0x10) = pcVar7;
  lVar8 = __tls_get_addr(&PTR_0014af10);
  *(SEL *)(lVar8 + 0x28) = selector;
  oVar2.method = *(IMP *)local_28;
  lVar8 = __tls_get_addr(&PTR_0014af10);
  *(IMP *)(lVar8 + 0x20) = oVar2.method;
  poVar9 = (objc_slot *)__tls_get_addr(&PTR_0014af10);
  return poVar9;
}

Assistant:

struct objc_slot *objc_msg_lookup_sender(id *receiver, SEL selector, id sender)
{
	// Returning a nil slot allows the caller to cache the lookup for nil too,
	// although this is not particularly useful because the nil method can be
	// inlined trivially.
	if (UNLIKELY(*receiver == nil))
	{
		// Return the correct kind of zero, depending on the type encoding.
		if (selector->types)
		{
			const char *t = selector->types;
			// Skip type qualifiers
			while ('r' == *t || 'n' == *t || 'N' == *t || 'o' == *t ||
			       'O' == *t || 'R' == *t || 'V' == *t || 'A' == *t)
			{
				t++;
			}
			switch (selector->types[0])
			{
				case 'D': return &nil_slot_D_v1;
				case 'd': return &nil_slot_d_v1;
				case 'f': return &nil_slot_f_v1;
			}
		}
		return &nil_slot_v1;
	}

	struct objc_slot2 *slot = objc_msg_lookup_internal(receiver, selector, NULL);
	uncacheable_slot_v1.owner = Nil;
	uncacheable_slot_v1.types = sel_getType_np(((struct objc_method*)slot)->selector);
	uncacheable_slot_v1.selector = selector;
	uncacheable_slot_v1.method = slot->method;
	return &uncacheable_slot_v1;
}